

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::doAddClique
          (HighsCliqueTable *this,CliqueVar *cliquevars,HighsInt numcliquevars,bool equality,
          HighsInt origin)

{
  const_iterator __position;
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  reference pvVar5;
  reference ppVar6;
  char *pcVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  byte in_CL;
  int in_EDX;
  int __c;
  int extraout_EDX;
  int __c_00;
  int extraout_EDX_00;
  long in_RSI;
  value_type *__s;
  HighsCliqueTable *in_RDI;
  HighsInt in_R8D;
  HighsInt cliqueLen;
  bool inserted;
  HighsInt j;
  bool clqHasVCompl;
  CliqueVar v;
  HighsInt i;
  HighsInt k;
  bool fixtozero;
  pair<int,_int> freespace;
  HighsInt maxEnd;
  iterator it;
  HighsInt cliqueid;
  CliqueVar in_stack_fffffffffffffeb8;
  CliqueVar in_stack_fffffffffffffebc;
  key_type *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  HighsInt HVar11;
  undefined4 in_stack_fffffffffffffed0;
  uint uVar12;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  HighsCliqueTable *in_stack_fffffffffffffee0;
  vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
  *in_stack_fffffffffffffef0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffef8;
  vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
  *in_stack_ffffffffffffff00;
  bool local_e9;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  HighsInt in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_ffffffffffffff28;
  bool local_c1;
  bool local_89;
  uint local_88;
  CliqueVar local_84;
  CliqueVar local_80;
  bool local_79;
  value_type local_78;
  int local_74;
  uint local_70;
  byte local_69;
  _Base_ptr local_68;
  _Base_ptr local_60;
  pair<int,_int> local_58;
  _Self local_50;
  undefined4 local_44;
  pair<int,_int> local_40;
  _Base_ptr local_38;
  int local_2c;
  _Rb_tree_const_iterator<std::pair<int,_int>_> local_28;
  uint local_20;
  HighsInt local_1c;
  byte local_15;
  int local_14;
  long local_10;
  
  local_15 = in_CL & 1;
  local_1c = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  bVar2 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (bVar2) {
    sVar10 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                       (&in_RDI->cliques);
    local_20 = (uint)sVar10;
    std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::emplace_back<>
              ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
               in_stack_fffffffffffffec0);
  }
  else {
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::back
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
    local_20 = *puVar4;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x531e15);
  }
  bVar1 = local_15;
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)(int)local_20);
  pvVar5->equality = (bool)(bVar1 & 1);
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)(int)local_20);
  pvVar5->origin = local_1c;
  std::_Rb_tree_const_iterator<std::pair<int,_int>_>::_Rb_tree_const_iterator(&local_28);
  bVar2 = std::
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::empty((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)0x531e98);
  local_c1 = true;
  if (!bVar2) {
    in_stack_ffffffffffffff28 =
         (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *
         )&in_RDI->freespaces;
    local_44 = 0xffffffff;
    local_40 = std::make_pair<int&,int>
                         ((int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                          (int *)0x531edd);
    local_38 = (_Base_ptr)
               std::
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::lower_bound((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                             in_stack_fffffffffffffec0);
    local_28._M_node = local_38;
    local_50._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_c1 = std::operator==(&local_28,&local_50);
  }
  if (local_c1 == false) {
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x532038);
    local_58 = *ppVar6;
    local_60 = local_28._M_node;
    __position._M_node._4_4_ = in_stack_fffffffffffffecc;
    __position._M_node._0_4_ = in_stack_fffffffffffffec8;
    local_68 = (_Base_ptr)
               std::
               set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
               ::erase_abi_cxx11_((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                   *)in_stack_fffffffffffffec0,__position);
    in_stack_ffffffffffffff18 = local_58.second;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    pvVar5->start = in_stack_ffffffffffffff18;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    in_stack_ffffffffffffff1c = pvVar5->start + local_14;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    pvVar5->end = in_stack_ffffffffffffff1c;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    local_2c = pvVar5->start + local_58.first;
  }
  else {
    sVar10 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::size(&in_RDI->cliqueentries);
    in_stack_ffffffffffffff20 = (HighsInt)sVar10;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    pvVar5->start = in_stack_ffffffffffffff20;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    in_stack_ffffffffffffff24 = pvVar5->start + local_14;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    pvVar5->end = in_stack_ffffffffffffff24;
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    local_2c = pvVar5->end;
    std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
              (&in_RDI->cliques,(long)(int)local_20);
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
              (&in_stack_fffffffffffffee0->cliqueentries,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)(int)local_20);
  pvVar5->numZeroFixed = 0;
  local_69 = 0;
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)(int)local_20);
  local_70 = pvVar5->start;
  for (local_74 = 0; local_74 != local_14; local_74 = local_74 + 1) {
    local_78 = *(value_type *)(local_10 + (long)local_74 * 4);
    __s = &local_78;
    resolveSubstitution(in_stack_fffffffffffffee0,
                        (CliqueVar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if ((local_69 & 1) == 0) {
      if (local_14 == 2) {
        local_80 = CliqueVar::complement
                             ((CliqueVar *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        pcVar7 = CliqueVar::index(&local_80,(char *)__s,__c);
        std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
        operator[](&in_RDI->invertedHashListSizeTwo,(long)(int)pcVar7);
        puVar4 = &local_20;
        local_e9 = HighsHashTree<int,_void>::contains
                             ((HighsHashTree<int,_void> *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        iVar3 = extraout_EDX;
      }
      else {
        in_stack_ffffffffffffff00 = &in_RDI->invertedHashList;
        local_84 = CliqueVar::complement
                             ((CliqueVar *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        pcVar7 = CliqueVar::index(&local_84,(char *)__s,__c_00);
        std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
                  (in_stack_ffffffffffffff00,(long)(int)pcVar7);
        puVar4 = &local_20;
        local_e9 = HighsHashTree<int,_int>::contains
                             ((HighsHashTree<int,_int> *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        iVar3 = extraout_EDX_00;
      }
      local_79 = local_e9;
      if (local_e9 == false) {
        if (local_14 == 2) {
          in_stack_fffffffffffffef0 = &in_RDI->invertedHashListSizeTwo;
          pcVar7 = CliqueVar::index(&local_78,(char *)puVar4,iVar3);
          std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
          operator[](in_stack_fffffffffffffef0,(long)(int)pcVar7);
          local_89 = HighsHashTree<int,void>::insert<int&>
                               ((HighsHashTree<int,_void> *)in_stack_ffffffffffffff00,
                                (int *)in_stack_fffffffffffffef8);
        }
        else {
          pcVar7 = CliqueVar::index(&local_78,(char *)puVar4,iVar3);
          std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
          operator[](&in_RDI->invertedHashList,(long)(int)pcVar7);
          local_89 = HighsHashTree<int,int>::insert<int&,int&>
                               ((HighsHashTree<int,_int> *)in_stack_ffffffffffffff00,
                                (int *)in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0);
        }
        if (local_89 == false) {
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    (value_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
        else {
          pcVar7 = (char *)(long)(int)local_70;
          pvVar8 = std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::operator[](&in_RDI->cliqueentries,(size_type)pcVar7);
          *pvVar8 = local_78;
          in_stack_fffffffffffffee0 = (HighsCliqueTable *)&in_RDI->numcliquesvar;
          pcVar7 = CliqueVar::index(&local_78,pcVar7,(int)local_78);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
                              (long)(int)pcVar7);
          *pvVar9 = *pvVar9 + 1;
          local_70 = local_70 + 1;
        }
      }
      else {
        local_69 = 1;
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        for (local_88 = pvVar5->start; local_88 != local_70; local_88 = local_88 + 1) {
          pvVar8 = std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::operator[](&in_RDI->cliqueentries,(long)(int)local_88);
          if (((uint)*pvVar8 & 0x7fffffff) != ((uint)local_78 & 0x7fffffff)) {
            in_stack_fffffffffffffef8 = &in_RDI->infeasvertexstack;
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            operator[](&in_RDI->cliqueentries,(long)(int)local_88);
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (value_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          }
          unlink(in_RDI,(char *)(ulong)local_88);
        }
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        local_70 = pvVar5->start;
      }
    }
    else {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (value_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
  }
  if ((int)local_70 < local_2c) {
    sVar10 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::size(&in_RDI->cliqueentries);
    if ((int)sVar10 == local_2c) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
                (&in_stack_fffffffffffffee0->cliqueentries,
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    else {
      std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::emplace<int,int&>((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                           *)in_stack_fffffffffffffee0,
                          (int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    }
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    if ((int)local_70 < pvVar5->end) {
      uVar12 = local_70;
      pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[](&in_RDI->cliques,(long)(int)local_20);
      iVar3 = uVar12 - pvVar5->start;
      if (uVar12 == pvVar5->start) {
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        pvVar5->start = -1;
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        pvVar5->end = -1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        return;
      }
      if (iVar3 == 1) {
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        unlink(in_RDI,(char *)(ulong)(uint)pvVar5->start);
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        pvVar5->start = -1;
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        pvVar5->end = -1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        return;
      }
      if (iVar3 == 2) {
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        unlink(in_RDI,(char *)(ulong)(uint)pvVar5->start);
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        unlink(in_RDI,(char *)(ulong)(pvVar5->start + 1));
        uVar12 = local_70;
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        pvVar5->end = uVar12;
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        link(in_RDI,(char *)(ulong)(uint)pvVar5->start,(char *)(ulong)local_20);
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        link(in_RDI,(char *)(ulong)(pvVar5->start + 1),(char *)(ulong)local_20);
      }
      else {
        uVar12 = local_70;
        pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[](&in_RDI->cliques,(long)(int)local_20);
        pvVar5->end = uVar12;
      }
    }
  }
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)(int)local_20);
  HVar11 = pvVar5->end;
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)(int)local_20);
  iVar3 = HVar11 - pvVar5->start;
  in_RDI->numEntries = iVar3 + in_RDI->numEntries;
  if (iVar3 == 2) {
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    operator[](&in_RDI->cliqueentries,(long)pvVar5->start);
    pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[](&in_RDI->cliques,(long)(int)local_20);
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    operator[](&in_RDI->cliqueentries,(long)(pvVar5->start + 1));
    sortedEdge(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
    insert<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
              (in_stack_ffffffffffffff28,
               (pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  return;
}

Assistant:

void HighsCliqueTable::doAddClique(const CliqueVar* cliquevars,
                                   HighsInt numcliquevars, bool equality,
                                   HighsInt origin) {
  HighsInt cliqueid;

  if (freeslots.empty()) {
    cliqueid = cliques.size();
    cliques.emplace_back();
  } else {
    cliqueid = freeslots.back();
    freeslots.pop_back();
  }

  cliques[cliqueid].equality = equality;
  cliques[cliqueid].origin = origin;

  std::set<std::pair<HighsInt, int>>::iterator it;
  HighsInt maxEnd;
  if (freespaces.empty() || (it = freespaces.lower_bound(std::make_pair(
                                 numcliquevars, -1))) == freespaces.end()) {
    cliques[cliqueid].start = cliqueentries.size();
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].end;
    cliqueentries.resize(cliques[cliqueid].end);
  } else {
    std::pair<HighsInt, int> freespace = *it;
    freespaces.erase(it);

    cliques[cliqueid].start = freespace.second;
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].start + freespace.first;
  }

  cliques[cliqueid].numZeroFixed = 0;

  bool fixtozero = false;
  HighsInt k = cliques[cliqueid].start;
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    CliqueVar v = cliquevars[i];

    resolveSubstitution(v);

    if (fixtozero) {
      infeasvertexstack.push_back(v);
      continue;
    }

    // due to substitutions the variable may occur together with its complement
    // in this clique and we can fix all other variables in the clique to zero:
    //          x + ~x + ... <= 1
    //   <=> x + 1 - x + ... <= 1
    //   <=>             ... <= 0
    bool clqHasVCompl =
        numcliquevars == 2
            ? invertedHashListSizeTwo[v.complement().index()].contains(cliqueid)
            : invertedHashList[v.complement().index()].contains(cliqueid);

    if (clqHasVCompl) {
      fixtozero = true;
      for (HighsInt j = cliques[cliqueid].start; j != k; ++j) {
        if (cliqueentries[j].col != v.col)
          infeasvertexstack.push_back(cliqueentries[j]);
        unlink(j, cliqueid);
      }
      k = cliques[cliqueid].start;
      continue;
    }

    // due to substitutions the variable may occur twice in this clique and
    // we can fix it to zero:  x + x + ... <= 1  <=>  2x <= 1 <=> x <= 0.5 <=>
    // x = 0
    bool inserted;
    if (numcliquevars == 2)
      inserted = invertedHashListSizeTwo[v.index()].insert(cliqueid);
    else
      inserted = invertedHashList[v.index()].insert(cliqueid, k);

    if (!inserted) {
      infeasvertexstack.push_back(v);
      continue;
    }

    cliqueentries[k] = v;
    ++numcliquesvar[v.index()];
    ++k;
  }

  if (maxEnd > k) {
    if (int(cliqueentries.size()) == maxEnd)
      cliqueentries.resize(k);
    else
      freespaces.emplace(maxEnd - k, k);

    if (cliques[cliqueid].end > k) {
      switch (k - cliques[cliqueid].start) {
        case 0:
          // clique empty, so just mark it as deleted
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 1:
          // size 1 clique is redundant, so unlink the single linked entry
          // and mark it as deleted
          unlink(cliques[cliqueid].start, cliqueid);
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 2:
          // due to substitutions the clique became smaller and is now of size
          // two as a result we need to link it to the size two cliqueset
          // instead of the normal cliqueset
          assert(cliqueid >= 0 && cliqueid < (HighsInt)cliques.size());
          assert(cliques[cliqueid].start >= 0 &&
                 cliques[cliqueid].start < (HighsInt)cliqueentries.size());
          unlink(cliques[cliqueid].start, cliqueid);
          unlink(cliques[cliqueid].start + 1, cliqueid);

          cliques[cliqueid].end = k;

          link(cliques[cliqueid].start, cliqueid);
          link(cliques[cliqueid].start + 1, cliqueid);
          break;
        default:
          cliques[cliqueid].end = k;
      }
    }
  }

  HighsInt cliqueLen = cliques[cliqueid].end - cliques[cliqueid].start;
  numEntries += cliqueLen;
  if (cliqueLen == 2)
    sizeTwoCliques.insert(
        sortedEdge(cliqueentries[cliques[cliqueid].start],
                   cliqueentries[cliques[cliqueid].start + 1]),
        cliqueid);
}